

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdVerify(Kit_DsdNtk_t *pNtk,uint *pTruth,int nVars)

{
  int iVar1;
  Kit_DsdMan_t *p_00;
  uint *pIn1;
  uint *pTruthC;
  Kit_DsdMan_t *p;
  int nVars_local;
  uint *pTruth_local;
  Kit_DsdNtk_t *pNtk_local;
  
  iVar1 = Kit_DsdNtkObjNum(pNtk);
  p_00 = Kit_DsdManAlloc(nVars,iVar1 + 2);
  pIn1 = Kit_DsdTruthCompute(p_00,pNtk);
  iVar1 = Extra_TruthIsEqual(pTruth,pIn1,nVars);
  if (iVar1 == 0) {
    printf("Verification failed.\n");
  }
  Kit_DsdManFree(p_00);
  return;
}

Assistant:

void Kit_DsdVerify( Kit_DsdNtk_t * pNtk, unsigned * pTruth, int nVars )
{
    Kit_DsdMan_t * p;
    unsigned * pTruthC;
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk)+2 );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Extra_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );
}